

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Stress::anon_unknown_0::RenderCase::checkResultImage(RenderCase *this,Surface *result)

{
  int x_00;
  RGBA y_00;
  byte bVar1;
  int iVar2;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  allocator<char> local_711;
  string local_710;
  allocator<char> local_6e9;
  string local_6e8;
  LogImage local_6c8;
  allocator<char> local_631;
  string local_630;
  allocator<char> local_609;
  string local_608;
  LogImageSet local_5e8;
  allocator<char> local_5a1;
  string local_5a0;
  allocator<char> local_579;
  string local_578;
  LogImage local_558;
  allocator<char> local_4c1;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  LogImage local_478;
  allocator<char> local_3e1;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  LogImageSet local_398;
  MessageBuilder local_358;
  deUint32 local_1d8;
  deUint32 local_1d4;
  RGBA local_1d0;
  int local_1cc;
  RGBA col;
  int x;
  int y;
  MessageBuilder local_1b8;
  byte local_31;
  undefined1 local_30 [7];
  bool error;
  Surface errorMask;
  Surface *result_local;
  RenderCase *this_local;
  
  errorMask.m_pixels.m_cap = (size_t)result;
  tcu::Surface::Surface((Surface *)local_30,0x100,0x100);
  local_31 = 0;
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1b8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [24])"Verifying output image.");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  for (col.m_value = 0; (int)col.m_value < 0x100; col.m_value = col.m_value + 1) {
    for (local_1cc = 0; local_1cc < 0x100; local_1cc = local_1cc + 1) {
      local_1d0 = tcu::Surface::getPixel((Surface *)errorMask.m_pixels.m_cap,local_1cc,col.m_value);
      iVar2 = tcu::RGBA::getGreen(&local_1d0);
      y_00 = col;
      x_00 = local_1cc;
      if (iVar2 == 0xff) {
        local_1d4 = (deUint32)tcu::RGBA::green();
        tcu::Surface::setPixel((Surface *)local_30,x_00,y_00.m_value,(RGBA)local_1d4);
      }
      else {
        local_1d8 = (deUint32)tcu::RGBA::red();
        tcu::Surface::setPixel((Surface *)local_30,x_00,y_00.m_value,(RGBA)local_1d8);
        local_31 = 1;
      }
    }
  }
  if ((local_31 & 1) == 0) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"Results",&local_609);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_630,"Result verification",&local_631);
    tcu::LogImageSet::LogImageSet(&local_5e8,&local_608,&local_630);
    pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_5e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e8,"Result",&local_6e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_710,"Result",&local_711);
    tcu::LogImage::LogImage
              (&local_6c8,&local_6e8,&local_710,(Surface *)errorMask.m_pixels.m_cap,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_6c8);
    tcu::TestLog::operator<<(pTVar3,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_6c8);
    std::__cxx11::string::~string((string *)&local_710);
    std::allocator<char>::~allocator(&local_711);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::allocator<char>::~allocator(&local_6e9);
    tcu::LogImageSet::~LogImageSet(&local_5e8);
    std::__cxx11::string::~string((string *)&local_630);
    std::allocator<char>::~allocator(&local_631);
    std::__cxx11::string::~string((string *)&local_608);
    std::allocator<char>::~allocator(&local_609);
  }
  else {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_358,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_358,(char (*) [43])"Result image has missing or invalid pixels");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_358);
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"Results",&local_3b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"Result verification",&local_3e1);
    tcu::LogImageSet::LogImageSet(&local_398,&local_3b8,&local_3e0);
    pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_398);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"Result",&local_499);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"Result",&local_4c1);
    tcu::LogImage::LogImage
              (&local_478,&local_498,&local_4c0,(Surface *)errorMask.m_pixels.m_cap,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_478);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"Error mask",&local_579)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a0,"Error mask",&local_5a1)
    ;
    tcu::LogImage::LogImage
              (&local_558,&local_578,&local_5a0,(Surface *)local_30,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_558);
    tcu::TestLog::operator<<(pTVar3,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_558);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::allocator<char>::~allocator(&local_5a1);
    std::__cxx11::string::~string((string *)&local_578);
    std::allocator<char>::~allocator(&local_579);
    tcu::LogImage::~LogImage(&local_478);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator(&local_4c1);
    std::__cxx11::string::~string((string *)&local_498);
    std::allocator<char>::~allocator(&local_499);
    tcu::LogImageSet::~LogImageSet(&local_398);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator(&local_3e1);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator(&local_3b9);
  }
  bVar1 = local_31 ^ 0xff;
  tcu::Surface::~Surface((Surface *)local_30);
  return (bool)(bVar1 & 1);
}

Assistant:

bool RenderCase::checkResultImage (const tcu::Surface& result)
{
	tcu::Surface	errorMask	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	bool			error		= false;

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying output image." << tcu::TestLog::EndMessage;

	for (int y = 0; y < TEST_CANVAS_SIZE; ++y)
	for (int x = 0; x < TEST_CANVAS_SIZE; ++x)
	{
		const tcu::RGBA col = result.getPixel(x, y);

		if (col.getGreen() == 255)
			errorMask.setPixel(x, y, tcu::RGBA::green());
		else
		{
			errorMask.setPixel(x, y, tcu::RGBA::red());
			error = true;
		}
	}

	if (error)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Result image has missing or invalid pixels" << tcu::TestLog::EndMessage;
		m_testCtx.getLog()
			<< tcu::TestLog::ImageSet("Results", "Result verification")
			<< tcu::TestLog::Image("Result",		"Result",		result)
			<< tcu::TestLog::Image("Error mask",	"Error mask",	errorMask)
			<< tcu::TestLog::EndImageSet;
	}
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::ImageSet("Results", "Result verification")
			<< tcu::TestLog::Image("Result", "Result", result)
			<< tcu::TestLog::EndImageSet;
	}

	return !error;
}